

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.h
# Opt level: O3

void __thiscall
jaegertracing::reporters::Config::Config
          (Config *this,int queueSize,duration *bufferFlushInterval,bool logSpans,
          string *localAgentHostPort,string *endpoint)

{
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = 100;
  if (0 < queueSize) {
    iVar3 = queueSize;
  }
  this->_queueSize = iVar3;
  lVar4 = 10000000000;
  if (0 < bufferFlushInterval->__r) {
    lVar4 = bufferFlushInterval->__r;
  }
  (this->_bufferFlushInterval).__r = lVar4;
  this->_logSpans = logSpans;
  sVar1 = localAgentHostPort->_M_string_length;
  (this->_localAgentHostPort)._M_dataplus._M_p = (pointer)&(this->_localAgentHostPort).field_2;
  if (sVar1 == 0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&this->_localAgentHostPort,"127.0.0.1:6831","");
  }
  else {
    pcVar2 = (localAgentHostPort->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&this->_localAgentHostPort,pcVar2,pcVar2 + sVar1);
  }
  (this->_endpoint)._M_dataplus._M_p = (pointer)&(this->_endpoint).field_2;
  pcVar2 = (endpoint->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_endpoint,pcVar2,pcVar2 + endpoint->_M_string_length);
  return;
}

Assistant:

explicit Config(
        int queueSize = kDefaultQueueSize,
        const Clock::duration& bufferFlushInterval =
            defaultBufferFlushInterval(),
        bool logSpans = false,
        const std::string& localAgentHostPort = kDefaultLocalAgentHostPort, const std::string& endpoint = kDefaultEndpoint)
        : _queueSize(queueSize > 0 ? queueSize : kDefaultQueueSize)
        , _bufferFlushInterval(bufferFlushInterval.count() > 0
                                   ? bufferFlushInterval
                                   : defaultBufferFlushInterval())
        , _logSpans(logSpans)
        , _localAgentHostPort(localAgentHostPort.empty()
                                  ? kDefaultLocalAgentHostPort
                                  : localAgentHostPort)
        , _endpoint(endpoint)
    {
    }